

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprDeleteNN(sqlite3 *db,Expr *p)

{
  Select *p_00;
  uint uVar1;
  
  uVar1 = p->flags;
  if ((uVar1 & 0x804000) == 0) {
    if ((p->pLeft != (Expr *)0x0) && (p->op != 0xaa)) {
      sqlite3ExprDeleteNN(db,p->pLeft);
    }
    if (p->pRight == (Expr *)0x0) {
      p_00 = (Select *)(p->x).pList;
      if ((p->flags & 0x800) == 0) {
        if (p_00 != (Select *)0x0) {
          exprListDeleteNN(db,(ExprList *)p_00);
        }
      }
      else if (p_00 != (Select *)0x0) {
        clearSelect(db,p_00,1);
      }
    }
    else {
      sqlite3ExprDeleteNN(db,p->pRight);
    }
    uVar1 = p->flags;
    if ((uVar1 >> 0x18 & 1) != 0) {
      sqlite3WindowDelete(db,(p->y).pWin);
      uVar1 = p->flags;
    }
  }
  if (((uVar1 >> 0x10 & 1) != 0) && ((p->u).zToken != (char *)0x0)) {
    sqlite3DbFreeNN(db,(p->u).zToken);
    uVar1 = p->flags;
  }
  if ((uVar1 >> 0x1b & 1) == 0) {
    sqlite3DbFreeNN(db,p);
    return;
  }
  return;
}

Assistant:

static SQLITE_NOINLINE void sqlite3ExprDeleteNN(sqlite3 *db, Expr *p){
  assert( p!=0 );
  /* Sanity check: Assert that the IntValue is non-negative if it exists */
  assert( !ExprHasProperty(p, EP_IntValue) || p->u.iValue>=0 );

  assert( !ExprHasProperty(p, EP_WinFunc) || p->y.pWin!=0 || db->mallocFailed );
  assert( p->op!=TK_FUNCTION || ExprHasProperty(p, EP_TokenOnly|EP_Reduced)
          || p->y.pWin==0 || ExprHasProperty(p, EP_WinFunc) );
#ifdef SQLITE_DEBUG
  if( ExprHasProperty(p, EP_Leaf) && !ExprHasProperty(p, EP_TokenOnly) ){
    assert( p->pLeft==0 );
    assert( p->pRight==0 );
    assert( p->x.pSelect==0 );
  }
#endif
  if( !ExprHasProperty(p, (EP_TokenOnly|EP_Leaf)) ){
    /* The Expr.x union is never used at the same time as Expr.pRight */
    assert( p->x.pList==0 || p->pRight==0 );
    if( p->pLeft && p->op!=TK_SELECT_COLUMN ) sqlite3ExprDeleteNN(db, p->pLeft);
    if( p->pRight ){
      sqlite3ExprDeleteNN(db, p->pRight);
    }else if( ExprHasProperty(p, EP_xIsSelect) ){
      sqlite3SelectDelete(db, p->x.pSelect);
    }else{
      sqlite3ExprListDelete(db, p->x.pList);
    }
    if( ExprHasProperty(p, EP_WinFunc) ){
      assert( p->op==TK_FUNCTION );
      sqlite3WindowDelete(db, p->y.pWin);
    }
  }
  if( ExprHasProperty(p, EP_MemToken) ) sqlite3DbFree(db, p->u.zToken);
  if( !ExprHasProperty(p, EP_Static) ){
    sqlite3DbFreeNN(db, p);
  }
}